

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

llama_sampler *
llama_sampler_init_logit_bias(int32_t n_vocab,int32_t n_logit_bias,llama_logit_bias *logit_bias)

{
  llama_sampler_i *iface;
  llama_sampler *plVar1;
  vector<llama_logit_bias,_std::allocator<llama_logit_bias>_> *in_RDX;
  undefined4 in_EDI;
  llama_sampler_context_t in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffdc;
  llama_logit_bias *in_stack_ffffffffffffffe0;
  llama_logit_bias *in_stack_ffffffffffffffe8;
  
  iface = (llama_sampler_i *)operator_new(0x38);
  uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffffd8);
  *(undefined4 *)&iface->name = in_EDI;
  std::allocator<llama_logit_bias>::allocator((allocator<llama_logit_bias> *)0x51904e);
  std::vector<llama_logit_bias,std::allocator<llama_logit_bias>>::
  vector<llama_logit_bias_const*,void>
            (in_RDX,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffffdc,uVar2));
  iface->clone = (_func_llama_sampler_ptr_llama_sampler_ptr *)0x0;
  iface->free = (_func_void_llama_sampler_ptr *)0x0;
  iface[1].name = (_func_char_ptr_llama_sampler_ptr *)0x0;
  std::vector<llama_logit_bias,_std::allocator<llama_logit_bias>_>::vector
            ((vector<llama_logit_bias,_std::allocator<llama_logit_bias>_> *)0x519089);
  plVar1 = llama_sampler_init(iface,in_stack_ffffffffffffffa8);
  std::allocator<llama_logit_bias>::~allocator((allocator<llama_logit_bias> *)0x5190af);
  return plVar1;
}

Assistant:

struct llama_sampler * llama_sampler_init_logit_bias(
                         int32_t   n_vocab,
                         int32_t   n_logit_bias,
          const llama_logit_bias * logit_bias) {
    return llama_sampler_init(
        /* .iface = */ &llama_sampler_logit_bias_i,
        /* .ctx   = */ new llama_sampler_logit_bias {
            /* .n_vocab    = */ n_vocab,
            /* .logit_bias = */ std::vector<llama_logit_bias>(logit_bias, logit_bias + n_logit_bias),
            /* .to_search  = */ {},
        }
    );
}